

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstructorCache.cpp
# Opt level: O0

void __thiscall
Js::ConstructorCache::Populate
          (ConstructorCache *this,DynamicType *type,ScriptContext *scriptContext,
          bool ctorHasNoExplicitReturnValue,bool updateAfterCtor)

{
  code *pcVar1;
  bool bVar2;
  uint16 uVar3;
  int iVar4;
  ScriptContext *pSVar5;
  undefined4 *puVar6;
  DynamicTypeHandler *pDVar7;
  bool updateAfterCtor_local;
  bool ctorHasNoExplicitReturnValue_local;
  ScriptContext *scriptContext_local;
  DynamicType *type_local;
  ConstructorCache *this_local;
  
  pSVar5 = Js::Type::GetScriptContext(&type->super_Type);
  if (scriptContext != pSVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                ,0x33,"(scriptContext == type->GetScriptContext())",
                                "scriptContext == type->GetScriptContext()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  bVar2 = DynamicType::GetIsShared(type);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                ,0x34,"(type->GetIsShared())","type->GetIsShared()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  bVar2 = IsConsistent(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                ,0x35,"(IsConsistent())","IsConsistent()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if ((((this->content).field_0x14 & 1) != 0) && (((byte)(this->content).field_0x14 >> 1 & 1) == 0))
  {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                ,0x36,"(!this->content.isPopulated || this->content.isPolymorphic)",
                                "!this->content.isPopulated || this->content.isPolymorphic");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pDVar7 = DynamicType::GetTypeHandler(type);
  iVar4 = DynamicTypeHandler::GetSlotCapacity(pDVar7);
  if (0xffff < iVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                ,0x37,"(type->GetTypeHandler()->GetSlotCapacity() <= 65535)",
                                "type->GetTypeHandler()->GetSlotCapacity() <= MaxCachedSlotCount");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  (this->content).field_0x14 = (this->content).field_0x14 & 0xfe | 1;
  PropertyGuard::SetValue(&this->super_PropertyGuard,(intptr_t)type);
  Memory::WriteBarrierPtr<Js::ScriptContext>::operator=
            (&(this->content).scriptContext,scriptContext);
  pDVar7 = DynamicType::GetTypeHandler(type);
  iVar4 = DynamicTypeHandler::GetSlotCapacity(pDVar7);
  (this->content).slotCount = iVar4;
  pDVar7 = DynamicType::GetTypeHandler(type);
  uVar3 = DynamicTypeHandler::GetInlineSlotCapacity(pDVar7);
  (this->content).inlineSlotCount = uVar3;
  (this->content).field_0x14 = (this->content).field_0x14 & 0xf7 | ctorHasNoExplicitReturnValue << 3
  ;
  (this->content).updateAfterCtor = updateAfterCtor;
  bVar2 = IsConsistent(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                ,0x3f,"(IsConsistent())","IsConsistent()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  return;
}

Assistant:

void ConstructorCache::Populate(DynamicType* type, ScriptContext* scriptContext, bool ctorHasNoExplicitReturnValue, bool updateAfterCtor)
    {
        Assert(scriptContext == type->GetScriptContext());
        Assert(type->GetIsShared());
        Assert(IsConsistent());
        Assert(!this->content.isPopulated || this->content.isPolymorphic);
        Assert(type->GetTypeHandler()->GetSlotCapacity() <= MaxCachedSlotCount);
        this->content.isPopulated = true;
        this->SetValue((intptr_t)type);
        this->content.scriptContext = scriptContext;
        this->content.slotCount = type->GetTypeHandler()->GetSlotCapacity();
        this->content.inlineSlotCount = type->GetTypeHandler()->GetInlineSlotCapacity();
        this->content.ctorHasNoExplicitReturnValue = ctorHasNoExplicitReturnValue;
        this->content.updateAfterCtor = updateAfterCtor;
        Assert(IsConsistent());
    }